

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arsenal.cpp
# Opt level: O1

string * AfterburnerUtil::trim(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + str->_M_string_length);
  if (str->_M_string_length == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar3];
      if ((cVar1 != '\t') && (cVar1 != ' ')) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar4] = cVar1;
        lVar4 = lVar4 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < str->_M_string_length);
  }
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string str) {
    // Convert all character in string to lower case
    std::string tmp = str;
    long number_of_char = 0;
    for (size_t ii = 0; ii < str.size(); ii++) {
        if (str[ii] != ' ' && str[ii] != '\t') {
            tmp[number_of_char] = str[ii];
            number_of_char++;
        }
    }
    tmp.resize(number_of_char);
    return tmp;
}